

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.h
# Opt level: O0

void __thiscall
Assimp::IFC::ConversionData::ConversionData
          (ConversionData *this,DB *db,IfcProject *proj,aiScene *out,Settings *settings)

{
  Settings *settings_local;
  aiScene *out_local;
  IfcProject *proj_local;
  DB *db_local;
  ConversionData *this_local;
  
  this->len_scale = 1.0;
  this->angle_scale = -1.0;
  this->db = db;
  this->proj = proj;
  this->out = out;
  aiMatrix4x4t<double>::aiMatrix4x4t(&this->wcs);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector(&this->meshes);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector(&this->materials);
  std::
  map<Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<Assimp::IFC::ConversionData::MeshCacheIndex>,_std::allocator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::map(&this->cached_meshes);
  std::
  map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
  ::map(&this->cached_materials);
  this->settings = settings;
  this->apply_openings =
       (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  this->collect_openings =
       (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&this->already_processed);
  return;
}

Assistant:

ConversionData(const STEP::DB& db, const IFC::Schema_2x3::IfcProject& proj, aiScene* out,const IFCImporter::Settings& settings)
        : len_scale(1.0)
        , angle_scale(-1.0)
        , db(db)
        , proj(proj)
        , out(out)
        , settings(settings)
        , apply_openings()
        , collect_openings()
    {}